

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

char16_t * __thiscall QtPrivate::qustrcasechr(QtPrivate *this,QStringView str,char16_t c)

{
  QtPrivate *pQVar1;
  bool bVar2;
  long lVar3;
  storage_type_conflict *psVar4;
  QtPrivate *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  char16_t local_3a;
  long local_38;
  
  psVar4 = str.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this + (long)psVar4 * 2;
  local_3a = foldCase((char16_t)str.m_size);
  lVar6 = (long)psVar4 * 2;
  for (lVar3 = (long)psVar4 >> 2; pQVar5 = this, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)this);
    if (bVar2) goto LAB_001200a3;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)(this + 2));
    pQVar5 = this + 2;
    if (bVar2) goto LAB_001200a3;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)(this + 4));
    pQVar5 = this + 4;
    if (bVar2) goto LAB_001200a3;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)(this + 6));
    pQVar5 = this + 6;
    if (bVar2) goto LAB_001200a3;
    this = this + 8;
    lVar6 = lVar6 + -8;
  }
  lVar6 = lVar6 >> 1;
  if (lVar6 == 1) {
LAB_0012008c:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
            operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a,
                       (QChar *)this);
    pQVar5 = this;
    if (bVar2) goto LAB_001200a3;
  }
  else {
    if (lVar6 == 2) {
LAB_00120072:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)this);
      pQVar5 = this;
      if (bVar2) goto LAB_001200a3;
      this = this + 2;
      goto LAB_0012008c;
    }
    if (lVar6 == 3) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::$_0>::
              operator()((_Iter_pred<QtPrivate::qustrcasechr(QStringView,char16_t)::__0> *)&local_3a
                         ,(QChar *)this);
      if (bVar2) goto LAB_001200a3;
      this = this + 2;
      goto LAB_00120072;
    }
  }
  pQVar5 = pQVar1;
LAB_001200a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (char16_t *)pQVar5;
}

Assistant:

Q_NEVER_INLINE
const char16_t *QtPrivate::qustrcasechr(QStringView str, char16_t c) noexcept
{
    const QChar *n = str.begin();
    const QChar *e = str.end();
    c = foldCase(c);
    auto it = std::find_if(n, e, [c](auto ch) { return foldAndCompare(ch, QChar(c)); });
    return reinterpret_cast<const char16_t *>(it);
}